

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O0

int script_status(int pi,uint script_id,uint32_t *param)

{
  void *in_RDX;
  uint32_t p [11];
  int status;
  int in_stack_00000fc0;
  int in_stack_00000fc4;
  void *in_stack_00000fc8;
  int in_stack_00000fd4;
  int local_48;
  undefined1 auStack_44 [4];
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  int local_14;
  
  local_14 = pigpio_command(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                            in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                            in_stack_ffffffffffffffc0);
  if (0 < local_14) {
    recvMax(in_stack_00000fd4,in_stack_00000fc8,in_stack_00000fc4,in_stack_00000fc0);
    local_14 = local_48;
    if (in_RDX != (void *)0x0) {
      memcpy(in_RDX,auStack_44,0x28);
    }
  }
  _pmu(0);
  return local_14;
}

Assistant:

int script_status(int pi, unsigned script_id, uint32_t *param)
{
   int status;
   uint32_t p[PI_MAX_SCRIPT_PARAMS+1]; /* space for script status */

   status = pigpio_command(pi, PI_CMD_PROCP, script_id, 0, 0);

   if (status > 0)
   {
      recvMax(pi, p, sizeof(p), status);
      status = p[0];
      if (param) memcpy(param, p+1, sizeof(p)-4);
   }

   _pmu(pi);

   return status;
}